

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppLogger.cpp
# Opt level: O0

void __thiscall
CppLogger::CppLogger::setFormat
          (CppLogger *this,initializer_list<CppLogger::FormatAttribute> t_Format)

{
  initializer_list<CppLogger::FormatAttribute> t_Format_00;
  initializer_list<CppLogger::FormatAttribute> t_Format_01;
  const_iterator pFVar1;
  const_iterator __last;
  FormatAttribute *pFVar2;
  Format local_c0;
  Format *local_a8;
  Format *format_1;
  Format *__end2_1;
  Format *__begin2_1;
  Format_0_ *__range2_1;
  CppLogger *local_78;
  iterator pFStack_70;
  Format local_60;
  Format *local_48;
  Format *format;
  Format *__end2;
  Format *__begin2;
  Format_0_ *__range2;
  CppLogger *local_20;
  CppLogger *this_local;
  initializer_list<CppLogger::FormatAttribute> t_Format_local;
  
  t_Format_local._M_array = (iterator)t_Format._M_len;
  this_local = (CppLogger *)t_Format._M_array;
  local_20 = this;
  pFVar1 = std::initializer_list<CppLogger::FormatAttribute>::begin
                     ((initializer_list<CppLogger::FormatAttribute> *)&this_local);
  __last = std::initializer_list<CppLogger::FormatAttribute>::end
                     ((initializer_list<CppLogger::FormatAttribute> *)&this_local);
  __range2._4_4_ = 4;
  pFVar2 = std::find<CppLogger::FormatAttribute_const*,CppLogger::FormatAttribute>
                     (pFVar1,__last,(FormatAttribute *)((long)&__range2 + 4));
  pFVar1 = std::initializer_list<CppLogger::FormatAttribute>::end
                     ((initializer_list<CppLogger::FormatAttribute> *)&this_local);
  if (pFVar2 == pFVar1) {
    format = (Format *)&this->m_ExitOnFatal;
    __end2 = (Format *)&this->field_0x28;
    __begin2 = __end2;
    for (; __end2 != format; __end2 = __end2 + 1) {
      local_48 = __end2;
      local_78 = this_local;
      pFStack_70 = t_Format_local._M_array;
      t_Format_01._M_len = (size_type)t_Format_local._M_array;
      t_Format_01._M_array = &this_local->m_Level;
      Format::Format(&local_60,t_Format_01);
      Format::operator=(local_48,&local_60);
      Format::~Format(&local_60);
      Format::addMessage(local_48);
    }
  }
  else {
    format_1 = (Format *)&this->m_ExitOnFatal;
    __end2_1 = (Format *)&this->field_0x28;
    __begin2_1 = __end2_1;
    for (; __end2_1 != format_1; __end2_1 = __end2_1 + 1) {
      local_a8 = __end2_1;
      t_Format_00._M_len = (size_type)t_Format_local._M_array;
      t_Format_00._M_array = &this_local->m_Level;
      Format::Format(&local_c0,t_Format_00);
      Format::operator=(local_a8,&local_c0);
      Format::~Format(&local_c0);
    }
  }
  return;
}

Assistant:

void CppLogger::setFormat(std::initializer_list<FormatAttribute> t_Format) {
        if (std::find(t_Format.begin(), t_Format.end(), FormatAttribute::Message) == t_Format.end()) {
            for(auto &format : m_Format) {
                format = t_Format;
                format.addMessage();
            }
        } else {
            for (auto &format: m_Format)
                format = t_Format;
        }
    }